

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighteraxe.cpp
# Opt level: O2

int AF_A_FAxeCheckUpG(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  player_t *player;
  AWeapon *this_00;
  bool bVar2;
  AAmmo *pAVar3;
  FState *state;
  long lVar4;
  char *__assertion;
  DObject *this_01;
  FName local_5c;
  VMValue params [3];
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005388ce;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005388be;
  this_01 = *(DObject **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (this_01 == (DObject *)0x0) goto LAB_00538768;
    bVar2 = DObject::IsKindOf(this_01,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005388ce;
    }
  }
  else {
    if (this_01 != (DObject *)0x0) goto LAB_005388be;
LAB_00538768:
    this_01 = (DObject *)0x0;
  }
  if (numparam == 1) goto LAB_005387e9;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_005388be:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_005388ce;
    }
    this = (DObject *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if ((this != (DObject *)0x0) &&
         (bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar2)) {
        __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005388ce;
      }
    }
    else if (this != (DObject *)0x0) goto LAB_005388be;
  }
  if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
     ((VVar1 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005387e9:
    player = *(player_t **)&this_01[0xc].ObjectFlags;
    if (player != (player_t *)0x0) {
      pAVar3 = GC::ReadBarrier<AAmmo>((AAmmo **)&player->ReadyWeapon->Ammo1);
      if ((pAVar3->super_AInventory).Amount < 1) {
        this_00 = player->ReadyWeapon;
        FName::FName(&local_5c,"Select");
        state = AActor::FindState((AActor *)this_00,&local_5c);
        P_SetPsprite(player,PSP_WEAPON,state,false);
      }
      else {
        params[0].field_0._8_4_ = 1;
        params[0].field_0.field_3.Type = '\x03';
        params[1].field_0.field_3.Type = '\x03';
        params[2].field_0.field_1.a = (void *)0x0;
        params[2].field_0.field_1.atag = 8;
        params[2].field_0.field_3.Type = '\x03';
        params[0].field_0._0_8_ = this_01;
        params[1].field_0._0_8_ = this_01;
        params[1].field_0._8_4_ = params[0].field_0._8_4_;
        VMFrameStack::Call(stack,&A_Raise_VMPtr->super_VMFunction,params,3,(VMReturn *)0x0,0,
                           (VMException **)0x0);
        lVar4 = 0x20;
        do {
          VMValue::~VMValue((VMValue *)((long)&params[0].field_0 + lVar4));
          lVar4 = lVar4 + -0x10;
        } while (lVar4 != -0x10);
      }
    }
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_005388ce:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighteraxe.cpp"
                ,0x96,"int AF_A_FAxeCheckUpG(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FAxeCheckUpG)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player;

	if (nullptr == (player = self->player))
	{
		return 0;
	}
	if (player->ReadyWeapon->Ammo1->Amount <= 0)
	{
		P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->FindState ("Select"));
	}
	else
	{
		CALL_ACTION(A_Raise, self);
	}
	return 0;
}